

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::set_outflow_bcs
          (Projection *this,int which_call,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Vel_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Divu_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Sig_in,int c_lev,int f_lev,
          int have_divu)

{
  int *piVar1;
  undefined8 *puVar2;
  ostringstream *this_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  IndexType IVar6;
  pointer pGVar7;
  byte bVar8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  Box *pBVar15;
  long lVar16;
  Box *b;
  int iVar17;
  int iVar18;
  int dir;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  Orientation *outFacesAtThisLevel_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi_00;
  int Divu;
  int Divu_Type;
  bool hasOutFlow;
  int numOutFlowFacesAtAllLevels;
  BoxArray uncovered_outflow_ba;
  Orientation outFaces [6];
  int icount [10];
  int fine_level [6];
  int numOutFlowFaces [10];
  Orientation outFacesAtThisLevel [10] [6];
  Box state_strip [10] [6];
  MultiFab *in_stack_fffffffffffff678;
  MultiFab *in_stack_fffffffffffff680;
  int in_stack_fffffffffffff690;
  int local_964 [3];
  undefined8 local_958;
  IndexType IStack_950;
  int iStack_94c;
  int local_948;
  int local_944;
  IndexType IStack_940;
  bool local_939;
  pointer local_938;
  IndexType IStack_930;
  int aiStack_92c [3];
  IndexType IStack_920;
  Amr *local_918;
  int local_90c;
  uint local_908;
  int local_904;
  Box *local_900;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_8f8;
  Projection *local_8f0;
  uint local_8e4;
  long local_8e0;
  undefined1 local_8d8 [72];
  element_type *local_890;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_870;
  ulong local_868;
  uint local_860;
  Box local_858;
  undefined1 local_838 [32];
  undefined8 local_818;
  int aiStack_808 [8];
  int aiStack_7e8 [12];
  Orientation local_7b8 [57];
  undefined8 uStack_6d4;
  undefined4 uStack_6cc;
  Print local_6c8 [4];
  
  local_8f8 = phi;
  local_8f0 = this;
  if (verbose != 0) {
    local_6c8[0].os = amrex::OutStream();
    local_6c8[0].rank = *(int *)(DAT_00842950 + -0x30);
    this_00 = &local_6c8[0].ss;
    local_6c8[0].comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_6c8[0].field_0x18 + *(long *)(local_6c8[0]._16_8_ + -0x18)) =
         *(undefined8 *)(local_6c8[0].os + *(long *)(*(long *)local_6c8[0].os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"...setting outflow bcs for the nodal projection ... ",0x34);
    local_7b8[0].val._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_7b8,1);
    amrex::Print::~Print(local_6c8);
  }
  local_90c = f_lev;
  b = &local_858;
  local_858.smallend.vect[0] = -1;
  local_858.smallend.vect[1] = -1;
  local_858.smallend.vect[2] = -1;
  local_858.bigend.vect[0] = -1;
  local_858.bigend.vect[1] = -1;
  local_858.bigend.vect[2] = -1;
  local_8e4 = which_call;
  local_870 = Sig_in;
  memset(local_7b8,0xff,0xf0);
  OutFlowBC::GetOutFlowFaces(&local_939,(Orientation *)b,local_8f0->phys_bc,&local_904);
  lVar14 = 0xc;
  do {
    *(undefined8 *)((long)&uStack_6d4 + lVar14) = 0x100000001;
    *(undefined4 *)((long)&uStack_6cc + lVar14) = 1;
    *(undefined1 (*) [16])((long)&local_6c8[0].rank + lVar14) = (undefined1  [16])0x0;
    lVar14 = lVar14 + 0x1c;
  } while (lVar14 != 0x69c);
  local_838._16_16_ = (undefined1  [16])0x0;
  local_838._0_16_ = (undefined1  [16])0x0;
  local_818 = 0;
  local_938 = (pointer)0x100000001;
  IStack_930.itype = 1;
  aiStack_92c[0] = 0;
  aiStack_92c[1] = 0;
  aiStack_92c[2] = 0;
  IStack_920.itype = 0;
  local_8e0 = (long)f_lev;
  if (0 < local_904) {
    pBVar15 = (Box *)0x0;
    do {
      iVar18 = local_858.smallend.vect[(long)pBVar15];
      local_900 = pBVar15;
      aiStack_808[(long)pBVar15] = -1;
      if (c_lev <= f_lev) {
        uVar22 = iVar18 % 3;
        lVar16 = (long)(int)uVar22;
        bVar8 = (byte)uVar22 & 0x1f;
        local_908 = -2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8;
        lVar14 = local_8e0;
        do {
          local_918 = local_8f0->parent;
          pGVar7 = (local_8f0->parent->super_AmrCore).super_AmrMesh.geom.
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar18 = *(int *)((long)(pGVar7 + lVar14) + 0xac);
          iVar17 = *(int *)((long)(pGVar7 + lVar14) + 0xb0);
          uVar3 = *(uint *)((long)(pGVar7 + lVar14) + 0xb4);
          iVar4 = *(int *)((long)(pGVar7 + lVar14) + 0xb8);
          iVar5 = *(int *)((long)(pGVar7 + lVar14) + 0xbc);
          iVar12 = *(int *)((long)(pGVar7 + lVar14) + 0xc0);
          IVar6.itype = *(uint *)((long)(pGVar7 + lVar14) + 0xc4);
          if (local_858.smallend.vect[(long)local_900] - 3U < 3) {
            local_958 = (pointer)CONCAT44(iVar17,iVar18);
            IStack_950.itype = uVar3;
            local_964[0] = iVar4;
            local_964[1] = iVar5;
            local_964[2] = iVar12;
            local_868 = CONCAT44(IVar6.itype >> 1,IVar6.itype) & 0x100000001;
            local_860 = IVar6.itype >> 2 & 1;
            iVar20 = local_964[lVar16];
            uVar19 = ~*(uint *)((long)&local_868 + lVar16 * 4) & 1;
            *(uint *)((long)&local_958 + lVar16 * 4) = uVar19 + iVar20;
            local_964[lVar16] = uVar19 + iVar20 + 1;
            local_8d8._8_4_ = IStack_950.itype;
            local_8d8._0_8_ = local_958;
            local_8d8._20_4_ = local_964[2];
            local_8d8._12_4_ = local_964[0];
            local_8d8._16_4_ = local_964[1];
            local_938 = local_958;
            IStack_930.itype = IStack_950.itype;
            aiStack_92c[0] = local_964[0];
            aiStack_92c[1] = local_964[1];
            aiStack_92c[2] = local_964[2];
            IStack_920.itype = IVar6.itype & local_908;
            iVar20 = -2;
          }
          else {
            local_958 = (pointer)CONCAT44(iVar17,iVar18);
            IStack_950.itype = uVar3;
            local_964[0] = iVar4;
            local_964[1] = iVar5;
            local_964[2] = iVar12;
            iVar20 = *(int *)((long)&local_958 + lVar16 * 4);
            *(int *)((long)&local_958 + lVar16 * 4) = iVar20 + -2;
            local_964[lVar16] = iVar20 + -1;
            local_8d8._8_4_ = IStack_950.itype;
            local_8d8._0_8_ = local_958;
            local_8d8._20_4_ = local_964[2];
            local_8d8._12_4_ = local_964[0];
            local_8d8._16_4_ = local_964[1];
            local_938 = local_958;
            IStack_930.itype = IStack_950.itype;
            aiStack_92c[0] = local_964[0];
            aiStack_92c[1] = local_964[1];
            aiStack_92c[2] = local_964[2];
            IStack_920.itype = IVar6.itype & local_908;
            iVar20 = 2;
          }
          piVar1 = (int *)((long)&local_938 + lVar16 * 4);
          local_938 = (pointer)local_8d8._0_8_;
          IStack_930.itype = local_8d8._8_4_;
          aiStack_92c[0] = local_964[0];
          aiStack_92c[1] = local_964[1];
          aiStack_92c[2] = local_964[2];
          local_8d8._12_4_ = local_964[0];
          local_8d8._16_4_ = local_964[1];
          local_8d8._20_4_ = local_964[2];
          *piVar1 = *piVar1 + iVar20;
          aiStack_92c[lVar16] = aiStack_92c[lVar16] + iVar20;
          uVar21 = 0;
          do {
            if (uVar22 != uVar21) {
              piVar1 = (int *)((long)&local_938 + uVar21 * 4);
              *piVar1 = *piVar1 + -1;
              aiStack_92c[uVar21] = aiStack_92c[uVar21] + 1;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != 3);
          local_958._0_4_ = (int)local_938;
          local_958._4_4_ = (int)((ulong)local_938 >> 0x20);
          if (iVar18 < (int)local_958) {
            iVar18 = (int)local_958;
          }
          if (iVar17 < local_958._4_4_) {
            iVar17 = local_958._4_4_;
          }
          local_958._4_4_ = iVar17;
          local_958._0_4_ = iVar18;
          IStack_950.itype = uVar3;
          if ((int)uVar3 < (int)IStack_930.itype) {
            IStack_950.itype = IStack_930.itype;
          }
          iStack_94c = iVar4;
          if (aiStack_92c[0] < iVar4) {
            iStack_94c = aiStack_92c[0];
          }
          local_948 = iVar5;
          if (aiStack_92c[1] < iVar5) {
            local_948 = aiStack_92c[1];
          }
          if (aiStack_92c[2] < iVar12) {
            iVar12 = aiStack_92c[2];
          }
          IStack_940.itype = IStack_920.itype;
          local_944 = iVar12;
          b = (Box *)&local_958;
          amrex::complementIn((BoxArray *)local_8d8,b,
                              (BoxArray *)
                              ((long)(local_918->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t + 0xd8))
          ;
          if (((local_890->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               (local_890->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start) && (aiStack_808[(long)local_900] == -1)) {
            iVar18 = *(int *)(local_838 + lVar14 * 4);
            lVar13 = (long)iVar18;
            local_7b8[lVar14 * 6 + lVar13].val = local_858.smallend.vect[(long)local_900];
            puVar2 = (undefined8 *)((long)&local_6c8[0].os + lVar13 * 0x1c + lVar14 * 0xa8 + 4);
            *puVar2 = CONCAT44(aiStack_92c[1],aiStack_92c[0]);
            puVar2[1] = CONCAT44(IStack_920.itype,aiStack_92c[2]);
            *(pointer *)(&local_6c8[0].rank + lVar14 * 0x2a + lVar13 * 7) = local_938;
            *(ostream **)(&local_6c8[0].rank + lVar14 * 0x2a + lVar13 * 7 + 2) =
                 (ostream *)CONCAT44(aiStack_92c[0],IStack_930.itype);
            aiStack_808[(long)local_900] = (int)lVar14;
            *(int *)(local_838 + lVar14 * 4) = iVar18 + 1;
            b = local_900;
          }
          amrex::BoxArray::~BoxArray((BoxArray *)local_8d8);
          bVar10 = c_lev < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar10);
      }
      pBVar15 = (Box *)((long)(local_900->smallend).vect + 1);
    } while ((long)pBVar15 < (long)local_904);
  }
  if (c_lev <= f_lev) {
    lVar14 = local_8e0 - (ulong)(uint)(f_lev - c_lev);
    b = (Box *)(local_838 + lVar14 * 4);
    memcpy(aiStack_7e8 + lVar14,b,(ulong)(uint)(f_lev - c_lev) * 4 + 4);
  }
  pVVar9 = local_870;
  uVar22 = local_8e4;
  if ((local_8e4 == 0x3ec) || (phi_00 = local_8f8, local_8e4 == 0x3ea)) {
    local_8d8._0_8_ = local_8d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"divu","");
    b = (Box *)&local_958;
    bVar10 = amrex::AmrLevel::isStateVariable((string *)local_8d8,(int *)b,local_964);
    if ((undefined1 *)local_8d8._0_8_ != local_8d8 + 0x10) {
      b = (Box *)(CONCAT44(local_8d8._20_4_,local_8d8._16_4_) + 1);
      operator_delete((void *)local_8d8._0_8_,(ulong)b);
    }
    phi_00 = local_8f8;
    if (!bVar10) {
      amrex::Error_host("Projection::set_outflow_bcs: No divu.");
    }
  }
  local_918 = (Amr *)0x0;
  if ((uVar22 & 0xfffffffd) == 0x3e9) {
    local_918 = (Amr *)NavierStokesBase::gravity;
    local_8d8._0_8_ = local_8d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"divu","");
    b = (Box *)&local_958;
    bVar11 = amrex::AmrLevel::isStateVariable((string *)local_8d8,(int *)b,local_964);
    bVar10 = (double)local_918 == 0.0;
    if ((undefined1 *)local_8d8._0_8_ != local_8d8 + 0x10) {
      b = (Box *)(CONCAT44(local_8d8._20_4_,local_8d8._16_4_) + 1);
      operator_delete((void *)local_8d8._0_8_,(ulong)b);
    }
    phi_00 = local_8f8;
    if (bVar10 && !bVar11) {
      amrex::Error_host("Projection::set_outflow_bcs: No divu or gravity.");
    }
  }
  if (c_lev <= f_lev) {
    lVar14 = (long)c_lev;
    local_90c = local_90c + 1;
    pBVar15 = (Box *)(&local_6c8[0].rank + lVar14 * 0x2a);
    outFacesAtThisLevel_00 = local_7b8 + lVar14 * 6;
    do {
      if (0 < aiStack_7e8[lVar14]) {
        set_outflow_bcs_at_level
                  (local_8f0,(int)b,(int)lVar14,c_lev,pBVar15,outFacesAtThisLevel_00,
                   aiStack_7e8[lVar14],phi_00,in_stack_fffffffffffff678,in_stack_fffffffffffff680,
                   (pVVar9->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar14],in_stack_fffffffffffff690,
                   (Real)local_918);
      }
      lVar14 = lVar14 + 1;
      pBVar15 = pBVar15 + 6;
      outFacesAtThisLevel_00 = outFacesAtThisLevel_00 + 6;
    } while (local_90c != (int)lVar14);
  }
  return;
}

Assistant:

void
Projection::set_outflow_bcs (int        which_call,
                             const Vector<MultiFab*>& phi,
                             const Vector<MultiFab*>& Vel_in,
                             const Vector<MultiFab*>& Divu_in,
                             const Vector<MultiFab*>& Sig_in,
                             int        c_lev,
                             int        f_lev,
                             int        have_divu)
{
    AMREX_ASSERT((which_call == INITIAL_VEL  ) ||
                 (which_call == INITIAL_PRESS) ||
                 (which_call == INITIAL_SYNC ) ||
                 (which_call == LEVEL_PROJ   ) );

    if (which_call != LEVEL_PROJ)
        AMREX_ASSERT(c_lev == 0);

    if (verbose)
      amrex::Print() << "...setting outflow bcs for the nodal projection ... " << '\n';

    bool        hasOutFlow;
    Orientation outFaces[2*AMREX_SPACEDIM];
    Orientation outFacesAtThisLevel[maxlev][2*AMREX_SPACEDIM];

    int fine_level[2*AMREX_SPACEDIM];

    int numOutFlowFacesAtAllLevels;
    int numOutFlowFaces[maxlev];
    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFacesAtAllLevels);

    //
    // Get 2-wide cc box, state_strip, along interior of top.
    // Get 1-wide nc box, phi_strip  , along top.
    //
    const int ccStripWidth = 2;

//    const int nCompPhi    = 1;
//    const int srcCompVel  = Xvel;
//    const int srcCompDivu = 0;
//    const int   nCompVel  = AMREX_SPACEDIM;
//    const int   nCompDivu = 1;

    //
    // Determine the finest level such that the entire outflow face is covered
    // by boxes at this level (skip if doesnt touch, and bomb if only partially
    // covered).
    //
    Box state_strip[maxlev][2*AMREX_SPACEDIM];

    int icount[maxlev];
    for (int i=0; i < maxlev; i++) icount[i] = 0;

    //
    // This loop is only to define the number of outflow faces at each level.
    //
    Box temp_state_strip;
    for (int iface = 0; iface < numOutFlowFacesAtAllLevels; iface++)
    {
      const int outDir    = outFaces[iface].coordDir();

      fine_level[iface] = -1;
      for (int lev = f_lev; lev >= c_lev; lev--)
      {
        Box domain = parent->Geom(lev).Domain();

        if (outFaces[iface].faceDir() == Orientation::high)
        {
            temp_state_strip = amrex::adjCellHi(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,-ccStripWidth);
        }
        else
        {
            temp_state_strip = amrex::adjCellLo(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,ccStripWidth);
        }
        // Grow the box by one tangentially in order to get velocity bc's.
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
          if (dir != outDir) temp_state_strip.grow(dir,1);

        const BoxArray& Lgrids               = parent->getLevel(lev).boxArray();
        const Box&      valid_state_strip    = temp_state_strip & domain;
        const BoxArray  uncovered_outflow_ba = amrex::complementIn(valid_state_strip,Lgrids);

        AMREX_ASSERT( !(uncovered_outflow_ba.size() &&
                     amrex::intersect(Lgrids,valid_state_strip).size()) );

        if ( !(uncovered_outflow_ba.size()) && fine_level[iface] == -1) {
            int ii = icount[lev];
            outFacesAtThisLevel[lev][ii] = outFaces[iface];
            state_strip[lev][ii] = temp_state_strip;
            fine_level[iface] = lev;
            icount[lev]++;
        }
      }
    }

    for (int lev = f_lev; lev >= c_lev; lev--) {
      numOutFlowFaces[lev] = icount[lev];
    }

    NavierStokesBase* ns0 = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    AMREX_ASSERT(!(ns0 == 0));

    int Divu_Type, Divu;
    Real gravity = 0;

    if (which_call == INITIAL_SYNC || which_call == INITIAL_VEL)
    {
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
        amrex::Error("Projection::set_outflow_bcs: No divu.");
    }

    if (which_call == INITIAL_PRESS || which_call == LEVEL_PROJ)
    {
      gravity = ns0->getGravity();
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu) &&
          (gravity == 0) )
        amrex::Error("Projection::set_outflow_bcs: No divu or gravity.");
    }

    for (int lev = c_lev; lev <= f_lev; lev++)
    {
      if (numOutFlowFaces[lev] > 0)
        set_outflow_bcs_at_level (which_call,lev,c_lev,
                                  state_strip[lev],
                                  outFacesAtThisLevel[lev],
                                  numOutFlowFaces[lev],
                                  phi,
                                  Vel_in[lev],
                                  Divu_in[lev],
                                  Sig_in[lev],
                                  have_divu,
                                  gravity);

    }

}